

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O1

void __thiscall Propagator::propagate(Propagator *this,Wave *wave)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer paVar6;
  uint *puVar7;
  pointer ptVar8;
  uint *puVar9;
  uint direction;
  long lVar10;
  uint x;
  uint y;
  
  ptVar8 = (this->propagating).
           super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar8 != (this->propagating).
                super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    do {
      uVar2 = ptVar8[-1].super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
              super__Head_base<0UL,_unsigned_int,_false>._M_head_impl;
      uVar3 = ptVar8[-1].super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
              _M_head_impl;
      uVar4 = ptVar8[-1].super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
              super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
      (this->propagating).
      super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ptVar8 + -1;
      lVar10 = 0;
      do {
        x = directions_x[lVar10] + uVar4;
        if (this->periodic_output == true) {
          x = (x + wave->width) % wave->width;
          y = (directions_y[lVar10] + uVar2 + wave->height) % wave->height;
LAB_00103224:
          paVar6 = (this->propagator_state).
                   super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar9 = *(uint **)&paVar6[uVar3]._M_elems[lVar10].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl;
          puVar7 = *(pointer *)
                    ((long)&paVar6[uVar3]._M_elems[lVar10].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    + 8);
          if (puVar9 < puVar7) {
            uVar5 = wave->width;
            do {
              piVar1 = (this->compatible).data.
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [((this->compatible).width * (long)(int)y + (long)(int)x) *
                        (this->compatible).depth + (ulong)*puVar9]._M_elems + lVar10;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                add_to_propagator(this,y,x,*puVar9);
                Wave::set(wave,uVar5 * y + x,*puVar9,false);
              }
              puVar9 = puVar9 + 1;
            } while (puVar9 < puVar7);
          }
        }
        else if ((((-1 < (int)x) && ((int)x < (int)wave->width)) &&
                 (y = directions_y[lVar10] + uVar2, -1 < (int)y)) && ((int)y < (int)wave->height))
        goto LAB_00103224;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      ptVar8 = (this->propagating).
               super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (ptVar8 != (this->propagating).
                       super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Propagator::propagate(Wave &wave) noexcept {

  // We propagate every element while there is element to propagate.
  while (propagating.size() != 0) {

    // The cell and pattern that has been set to false.
    unsigned y1, x1, pattern;
    std::tie(y1, x1, pattern) = propagating.back();
    propagating.pop_back();

    // We propagate the information in all 4 directions.
    for (unsigned direction = 0; direction < 4; direction++) {

      // We get the next cell in the direction direction.
      int dx = directions_x[direction];
      int dy = directions_y[direction];
      int x2, y2;
      if (periodic_output) {
        x2 = ((int)x1 + dx + (int)wave.width) % wave.width;
        y2 = ((int)y1 + dy + (int)wave.height) % wave.height;
      } else {
        x2 = x1 + dx;
        y2 = y1 + dy;
        if (x2 < 0 || x2 >= (int)wave.width) {
          continue;
        }
        if (y2 < 0 || y2 >= (int)wave.height) {
          continue;
        }
      }

      // The index of the second cell, and the patterns compatible
      unsigned i2 = x2 + y2 * wave.width;
      const std::vector<unsigned> &patterns =
        propagator_state[pattern][direction];

      // For every pattern that could be placed in that cell without being in
      // contradiction with pattern1
      for (auto it = patterns.begin(), it_end = patterns.end(); it < it_end;
           ++it) {

        // We decrease the number of compatible patterns in the opposite
        // direction If the pattern was discarded from the wave, the element
        // is still negative, which is not a problem
        std::array<int, 4> &value = compatible.get(y2, x2, *it);
        value[direction]--;

        // If the element was set to 0 with this operation, we need to remove
        // the pattern from the wave, and propagate the information
        if (value[direction] == 0) {
          add_to_propagator(y2, x2, *it);
          wave.set(i2, *it, false);
        }
      }
    }
  }
}